

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_node<_IO_FILE*>(SingleTreeIndex *node,_IO_FILE **out)

{
  size_type sVar1;
  FILE **in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_t vec_size;
  
  if (!interrupt_switch) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67ae30);
      write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x67ae7a);
      write_bytes<double>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 2));
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x67aec4);
      write_bytes<double>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 3);
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67af0e);
      write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 4);
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67af58);
      write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 5);
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    if (sVar1 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x67afa2);
      write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
    }
    write_bytes<unsigned_long>((void *)vec_size,(size_t)in_RDI,in_RSI);
  }
  return;
}

Assistant:

void serialize_node(const SingleTreeIndex &node, otype &out)
{
    if (interrupt_switch) return;

    size_t vec_size = node.terminal_node_mappings.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.terminal_node_mappings.data(), vec_size, out);

    vec_size = node.node_distances.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_distances.data(), vec_size, out);

    vec_size = node.node_depths.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<double>((void*)node.node_depths.data(), vec_size, out);

    vec_size = node.reference_points.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_points.data(), vec_size, out);

    vec_size = node.reference_indptr.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_indptr.data(), vec_size, out);

    vec_size = node.reference_mapping.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
    if (vec_size)
        write_bytes<size_t>((void*)node.reference_mapping.data(), vec_size, out);

    vec_size = node.n_terminal;
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);
}